

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_stadium
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::sse2>_> *position)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined4 extraout_EAX;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar9;
  ulong uVar8;
  float fVar10;
  float fVar11;
  batch bVar12;
  batch bVar13;
  batch bVar14;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> position_t;
  float local_88;
  float fStack_84;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> local_48;
  
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_>::transform(&local_48,position,ctx->flippedBasis);
  fVar11 = ctx->circle_test[0];
  fVar3 = ctx->circle_test[1];
  bVar12.super_simd_register<float,_xsimd::sse2>.data[2] =
       fVar3 * local_48.y.super_simd_register<float,_xsimd::sse2>.data[0];
  bVar12.super_simd_register<float,_xsimd::sse2>.data[3] =
       fVar3 * local_48.y.super_simd_register<float,_xsimd::sse2>.data[1];
  fVar7 = fVar11 * ABS(local_48.x.super_simd_register<float,_xsimd::sse2>.data[0]) +
          bVar12.super_simd_register<float,_xsimd::sse2>.data[2];
  fVar9 = fVar11 * ABS(local_48.x.super_simd_register<float,_xsimd::sse2>.data[1]) +
          bVar12.super_simd_register<float,_xsimd::sse2>.data[3];
  fVar10 = fVar11 * ABS(local_48.x.super_simd_register<float,_xsimd::sse2>.data[2]) +
           fVar3 * local_48.y.super_simd_register<float,_xsimd::sse2>.data[2];
  fVar11 = fVar11 * ABS(local_48.x.super_simd_register<float,_xsimd::sse2>.data[3]) +
           fVar3 * local_48.y.super_simd_register<float,_xsimd::sse2>.data[3];
  uVar8 = CONCAT44(local_48.z.super_simd_register<float,_xsimd::sse2>.data[1],
                   local_48.z.super_simd_register<float,_xsimd::sse2>.data[0]) & 0x7fffffff7fffffff;
  bVar12.super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar8;
  bVar12.super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)(uVar8 >> 0x20);
  bVar12 = weight_from_sin(this,ctx,bVar12);
  uVar8 = bVar12.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  bVar13.super_simd_register<float,_xsimd::sse2>.data[2] =
       ctx->right_circle_centre[1] * local_48.y.super_simd_register<float,_xsimd::sse2>.data[0];
  bVar13.super_simd_register<float,_xsimd::sse2>.data[3] =
       ctx->right_circle_centre[1] * local_48.y.super_simd_register<float,_xsimd::sse2>.data[1];
  bVar13.super_simd_register<float,_xsimd::sse2>.data[0] =
       ctx->right_circle_centre[0] * ABS(local_48.x.super_simd_register<float,_xsimd::sse2>.data[0])
       + bVar13.super_simd_register<float,_xsimd::sse2>.data[2];
  bVar13.super_simd_register<float,_xsimd::sse2>.data[1] =
       ctx->right_circle_centre[0] * ABS(local_48.x.super_simd_register<float,_xsimd::sse2>.data[1])
       + bVar13.super_simd_register<float,_xsimd::sse2>.data[3];
  bVar13 = weight_from_cos(this,ctx,bVar13);
  uVar5 = -(uint)(fVar7 < 0.0);
  uVar6 = -(uint)(fVar9 < 0.0);
  auVar1._4_4_ = uVar6;
  auVar1._0_4_ = uVar5;
  auVar1._8_4_ = -(uint)(fVar10 < 0.0);
  auVar1._12_4_ = -(uint)(fVar11 < 0.0);
  iVar4 = movmskps(extraout_EAX,auVar1);
  if (iVar4 != 0) {
    uVar5 = -(uint)(0.0 <= fVar7);
    uVar6 = -(uint)(0.0 <= fVar9);
    auVar2._4_4_ = uVar6;
    auVar2._0_4_ = uVar5;
    auVar2._8_4_ = -(uint)(0.0 <= fVar10);
    auVar2._12_4_ = -(uint)(0.0 <= fVar11);
    iVar4 = movmskps(iVar4,auVar2);
    if (iVar4 == 0) {
      uVar8 = bVar13.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    }
    else {
      local_88 = bVar12.super_simd_register<float,_xsimd::sse2>.data[0];
      fStack_84 = bVar12.super_simd_register<float,_xsimd::sse2>.data[1];
      uVar5 = ~-(uint)(0.0 <= fVar7) & (uint)bVar13.super_simd_register<float,_xsimd::sse2>.data[0];
      uVar6 = ~-(uint)(0.0 <= fVar9) & (uint)bVar13.super_simd_register<float,_xsimd::sse2>.data[1];
      uVar8 = CONCAT44((uint)fStack_84 & -(uint)(0.0 <= fVar9),
                       (uint)local_88 & -(uint)(0.0 <= fVar7)) | CONCAT44(uVar6,uVar5);
    }
  }
  bVar14.super_simd_register<float,_xsimd::sse2>.data[3] = (float)uVar6;
  bVar14.super_simd_register<float,_xsimd::sse2>.data[2] = (float)uVar5;
  bVar14.super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar8;
  bVar14.super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)(uVar8 >> 0x20);
  return (batch)bVar14.super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }